

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O0

size_t duckdb_zstd::HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  HUF_CElt *count;
  HUF_CElt *CTable;
  size_t sVar4;
  HUF_CElt *in_RCX;
  undefined1 *in_RDX;
  long in_RSI;
  uint *in_RDI;
  uint in_R8D;
  uint in_R9D;
  size_t newSize;
  size_t oldSize;
  size_t hSize;
  size_t _var_err__;
  size_t maxBits;
  size_t largest;
  size_t largestEnd;
  uint maxSymbolValueEnd;
  size_t largestBegin;
  uint maxSymbolValueBegin;
  size_t largestTotal;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  HUF_compress_tables_t *table;
  void *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  HUF_nbStreams_e in_stack_ffffffffffffff54;
  void *in_stack_ffffffffffffff58;
  uint *in_stack_ffffffffffffff60;
  uint *in_stack_ffffffffffffff68;
  uint *in_stack_ffffffffffffff70;
  HUF_CElt *in_stack_ffffffffffffff78;
  HUF_CElt *ostart_00;
  HUF_CElt *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  void *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  ulong in_stack_ffffffffffffffa8;
  long lVar5;
  uint *count_00;
  uint local_2c;
  HUF_CElt *local_8;
  
  pvVar3 = HUF_alignUpWorkspace((void *)newSize,&oldSize,8);
  if (oldSize < 0x1f08) {
    local_8 = (HUF_CElt *)0xffffffffffffffbe;
  }
  else if (in_RCX == (HUF_CElt *)0x0) {
    local_8 = (HUF_CElt *)0x0;
  }
  else if (in_RSI == 0) {
    local_8 = (HUF_CElt *)0x0;
  }
  else if (in_RCX < (HUF_CElt *)0x20001) {
    if (in_R9D < 0xd) {
      if (in_R8D < 0x100) {
        local_2c = in_R8D;
        if (in_R8D == 0) {
          local_2c = 0xff;
        }
        if (((((uint)maxBits & 4) == 0) || (_var_err__ == 0)) || (*(int *)_var_err__ != 2)) {
          count_00 = in_RDI;
          if ((((uint)maxBits & 8) != 0) && ((HUF_CElt *)0x9fff < in_RCX)) {
            lVar5 = 0;
            in_stack_ffffffffffffffa4 = local_2c;
            uVar1 = HIST_count_simple((uint *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                      in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
            in_stack_ffffffffffffff98 = (void *)(ulong)uVar1;
            uVar1 = ERR_isError((size_t)in_stack_ffffffffffffff98);
            if (uVar1 != 0) {
              return (size_t)in_stack_ffffffffffffff98;
            }
            lVar5 = (long)in_stack_ffffffffffffff98 + lVar5;
            uVar1 = HIST_count_simple((uint *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                      in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
            in_stack_ffffffffffffff88 = (HUF_CElt *)(ulong)uVar1;
            uVar1 = ERR_isError((size_t)in_stack_ffffffffffffff88);
            if (uVar1 != 0) {
              return (size_t)in_stack_ffffffffffffff88;
            }
            in_stack_ffffffffffffffa8 = (long)in_stack_ffffffffffffff88 + lVar5;
            in_stack_ffffffffffffff94 = local_2c;
            if (in_stack_ffffffffffffffa8 < 0x45) {
              return 0;
            }
          }
          count = (HUF_CElt *)
                  HIST_count_wksp(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                  in_stack_ffffffffffffff58,
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  in_stack_ffffffffffffff48,0x9d305c);
          uVar1 = ERR_isError((size_t)count);
          local_8 = count;
          if (uVar1 == 0) {
            if (count == in_RCX) {
              *(undefined1 *)count_00 = *in_RDX;
              local_8 = (HUF_CElt *)0x1;
            }
            else if ((HUF_CElt *)(((ulong)in_RCX >> 7) + 4) < count) {
              if (((_var_err__ != 0) && (*(int *)_var_err__ == 1)) &&
                 (iVar2 = HUF_validateCTable(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                             (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20)),
                 iVar2 == 0)) {
                *(undefined4 *)_var_err__ = 0;
              }
              if (((((uint)maxBits & 4) == 0) || (_var_err__ == 0)) || (*(int *)_var_err__ == 0)) {
                HUF_optimalTableLog((uint)in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4
                                    ,in_stack_ffffffffffffff98,
                                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                    in_stack_ffffffffffffff88,count_00,(int)pvVar3);
                CTable = (HUF_CElt *)
                         HUF_buildCTable_wksp
                                   (in_stack_ffffffffffffff88,(uint *)count,
                                    (U32)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                    (U32)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                    (size_t)in_stack_ffffffffffffff68);
                ostart_00 = CTable;
                uVar1 = ERR_isError((size_t)CTable);
                local_8 = CTable;
                if (uVar1 == 0) {
                  local_8 = (HUF_CElt *)
                            HUF_writeCTable_wksp
                                      (in_stack_ffffffffffffff98,
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff88,(uint)((ulong)count >> 0x20),
                                       (uint)count,ostart_00,(size_t)in_RDI);
                  iVar2 = (int)in_stack_ffffffffffffff98;
                  uVar1 = ERR_isError((size_t)local_8);
                  if (uVar1 == 0) {
                    if ((_var_err__ != 0) && (*(int *)_var_err__ != 0)) {
                      in_stack_ffffffffffffff60 =
                           (uint *)HUF_estimateCompressedSize
                                             (CTable,(uint *)local_8,
                                              (uint)((ulong)in_stack_ffffffffffffff60 >> 0x20));
                      in_stack_ffffffffffffff58 =
                           (void *)HUF_estimateCompressedSize
                                             (CTable,(uint *)local_8,
                                              (uint)((ulong)in_stack_ffffffffffffff60 >> 0x20));
                      if ((in_stack_ffffffffffffff60 <=
                           (uint *)((long)local_8 + (long)in_stack_ffffffffffffff58)) ||
                         (in_RCX <= (HUF_CElt *)((long)local_8 + 0xcU))) {
                        sVar4 = HUF_compressCTable_internal
                                          ((BYTE *)ostart_00,(BYTE *)CTable,(BYTE *)local_8,
                                           in_stack_ffffffffffffff60,
                                           (size_t)in_stack_ffffffffffffff58,
                                           in_stack_ffffffffffffff54,
                                           (HUF_CElt *)
                                           CONCAT44(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90),iVar2);
                        return sVar4;
                      }
                    }
                    if ((HUF_CElt *)((long)local_8 + 0xcU) < in_RCX) {
                      if (_var_err__ != 0) {
                        *(undefined4 *)_var_err__ = 0;
                      }
                      if (hSize != 0) {
                        memcpy((void *)hSize,(void *)((long)pvVar3 + 0x400),0x808);
                      }
                      local_8 = (HUF_CElt *)
                                HUF_compressCTable_internal
                                          ((BYTE *)ostart_00,(BYTE *)CTable,(BYTE *)local_8,
                                           in_stack_ffffffffffffff60,
                                           (size_t)in_stack_ffffffffffffff58,
                                           in_stack_ffffffffffffff54,
                                           (HUF_CElt *)
                                           CONCAT44(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90),iVar2);
                    }
                    else {
                      local_8 = (HUF_CElt *)0x0;
                    }
                  }
                }
              }
              else {
                local_8 = (HUF_CElt *)
                          HUF_compressCTable_internal
                                    ((BYTE *)in_stack_ffffffffffffff78,
                                     (BYTE *)in_stack_ffffffffffffff70,
                                     (BYTE *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                     (size_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                     (HUF_CElt *)
                                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                     (int)in_stack_ffffffffffffff98);
              }
            }
            else {
              local_8 = (HUF_CElt *)0x0;
            }
          }
        }
        else {
          local_8 = (HUF_CElt *)
                    HUF_compressCTable_internal
                              ((BYTE *)in_stack_ffffffffffffff78,(BYTE *)in_stack_ffffffffffffff70,
                               (BYTE *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                               (size_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                               (HUF_CElt *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               (int)in_stack_ffffffffffffff98);
        }
      }
      else {
        local_8 = (HUF_CElt *)0xffffffffffffffd2;
      }
    }
    else {
      local_8 = (HUF_CElt *)0xffffffffffffffd4;
    }
  }
  else {
    local_8 = (HUF_CElt *)0xffffffffffffffb8;
  }
  return (size_t)local_8;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}